

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O0

void __thiscall miniminer_tests::miniminer_overlap::test_method(miniminer_overlap *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  uint64_t uVar5;
  _Base_ptr p_Var6;
  initializer_list<COutPoint> __l;
  initializer_list<COutPoint> __l_00;
  initializer_list<COutPoint> __l_01;
  initializer_list<COutPoint> __l_02;
  initializer_list<COutPoint> __l_03;
  initializer_list<COutPoint> __l_04;
  initializer_list<COutPoint> __l_05;
  initializer_list<COutPoint> __l_06;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_07;
  initializer_list<COutPoint> __l_08;
  initializer_list<COutPoint> __l_09;
  initializer_list<COutPoint> __l_10;
  initializer_list<COutPoint> __l_11;
  initializer_list<transaction_identifier<false>_> __l_12;
  initializer_list<transaction_identifier<false>_> __l_13;
  initializer_list<transaction_identifier<false>_> __l_14;
  initializer_list<transaction_identifier<false>_> __l_15;
  initializer_list<transaction_identifier<false>_> __l_16;
  initializer_list<transaction_identifier<false>_> __l_17;
  initializer_list<transaction_identifier<false>_> __l_18;
  initializer_list<transaction_identifier<false>_> __l_19;
  bool bVar7;
  pointer ppVar8;
  CAmount CVar9;
  long *plVar10;
  reference pvVar11;
  MiniMiner *pMVar12;
  const_iterator pmVar13;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffb1e8;
  lazy_ostream *in_stack_ffffffffffffb1f0;
  char *in_stack_ffffffffffffb1f8;
  undefined4 in_stack_ffffffffffffb200;
  uint32_t in_stack_ffffffffffffb204;
  undefined4 in_stack_ffffffffffffb208;
  int in_stack_ffffffffffffb20c;
  COutPoint *in_stack_ffffffffffffb210;
  undefined4 in_stack_ffffffffffffb218;
  int in_stack_ffffffffffffb21c;
  CTxMemPoolEntry *in_stack_ffffffffffffb220;
  CTxMemPool *in_stack_ffffffffffffb228;
  undefined4 in_stack_ffffffffffffb230;
  uint in_stack_ffffffffffffb234;
  less<transaction_identifier<false>_> *in_stack_ffffffffffffb238;
  TestMemPoolEntryHelper *in_stack_ffffffffffffb240;
  size_t in_stack_ffffffffffffb250;
  undefined4 in_stack_ffffffffffffb258;
  undefined4 in_stack_ffffffffffffb25c;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  *in_stack_ffffffffffffb278;
  undefined4 in_stack_ffffffffffffb280;
  undefined4 in_stack_ffffffffffffb284;
  MiniMiner *in_stack_ffffffffffffb288;
  undefined4 in_stack_ffffffffffffb320;
  undefined4 in_stack_ffffffffffffb324;
  vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
  *in_stack_ffffffffffffb328;
  MiniMiner *in_stack_ffffffffffffb330;
  CFeeRate *in_stack_ffffffffffffb368;
  MiniMiner *in_stack_ffffffffffffb370;
  MiniMiner *local_4c78;
  vector<COutPoint,_std::allocator<COutPoint>_> *in_stack_ffffffffffffb568;
  vector<COutPoint,_std::allocator<COutPoint>_> *outpoints;
  CTxMemPool *in_stack_ffffffffffffb570;
  CTxMemPool *pCVar14;
  CTxMemPool *mempool;
  MiniMiner *in_stack_ffffffffffffb578;
  undefined1 *local_4008;
  map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
  *sequences;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  initializer_list<std::map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>_>
  *__range1_2;
  CTxMemPoolEntry *tx7_entry;
  CTxMemPoolEntry *tx6_entry;
  CTxMemPoolEntry *tx3_entry;
  COutPoint *outpoint;
  vector<COutPoint,_std::allocator<COutPoint>_> *__range1_1;
  shared_ptr<const_CTransaction> *tx;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range1;
  CTxMemPool *pool;
  miniminer_overlap *this_local;
  lazy_ostream local_3cc0;
  undefined1 local_3ca8 [64];
  lazy_ostream local_3c68;
  undefined1 local_3c50 [64];
  lazy_ostream local_3c10;
  undefined1 local_3bf8 [64];
  lazy_ostream local_3bb8;
  undefined1 local_3ba0 [64];
  lazy_ostream local_3b60;
  undefined1 local_3b48 [64];
  lazy_ostream local_3b08;
  undefined1 local_3af0 [64];
  lazy_ostream local_3ab0;
  undefined1 local_3a98 [64];
  lazy_ostream local_3a58;
  undefined1 local_3a40 [64];
  undefined1 *local_3a00;
  undefined8 local_39f8;
  const_string local_39f0 [2];
  lazy_ostream local_39d0 [2];
  assertion_result local_39b0 [2];
  const_string local_3978 [2];
  lazy_ostream local_3958 [2];
  assertion_result local_3938 [2];
  undefined1 local_38f2 [26];
  long local_38d8;
  undefined8 local_38d0;
  long local_38c8;
  undefined8 local_38c0;
  long local_38b8;
  vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> miniminer_info;
  lazy_ostream local_3894;
  undefined1 local_3880 [64];
  const_string local_3840 [2];
  lazy_ostream local_3820 [2];
  _Base_ptr local_3800;
  assertion_result local_37f8 [2];
  iterator tx7_bumpfee_2;
  lazy_ostream local_37b8;
  undefined1 local_37a0 [64];
  const_string local_3760 [2];
  lazy_ostream local_3740 [2];
  _Base_ptr local_3720;
  assertion_result local_3718 [2];
  iterator tx6_bumpfee_2;
  const_string local_36d8 [2];
  lazy_ostream local_36b8 [2];
  assertion_result local_3698 [2];
  lazy_ostream local_3660;
  undefined1 local_3650 [16];
  undefined1 local_3640 [64];
  const_string local_3600 [2];
  lazy_ostream local_35e0 [2];
  assertion_result local_35c0 [2];
  const_string local_3588 [2];
  lazy_ostream local_3568 [2];
  assertion_result local_3548 [2];
  const_string local_3510 [2];
  lazy_ostream local_34f0 [2];
  undefined8 local_34d0;
  assertion_result local_34c0 [2];
  undefined8 local_3488;
  CFeeRate just_above_tx6;
  lazy_ostream local_3478;
  undefined1 local_3460 [64];
  const_string local_3420 [2];
  lazy_ostream local_3400 [2];
  assertion_result local_33e0 [2];
  const_string local_33a8 [2];
  lazy_ostream local_3388 [2];
  assertion_result local_3368 [2];
  const_string local_3330 [2];
  lazy_ostream local_3310 [2];
  assertion_result local_32f0 [3];
  lazy_ostream local_3298;
  undefined1 local_3280 [64];
  const_string local_3240 [2];
  lazy_ostream local_3220 [2];
  _Base_ptr local_3200;
  assertion_result local_31f8 [2];
  iterator tx7_bumpfee_1;
  lazy_ostream local_31b8;
  undefined1 local_31a0 [64];
  const_string local_3160 [2];
  lazy_ostream local_3140 [2];
  _Base_ptr local_3120;
  assertion_result local_3118 [2];
  iterator tx6_bumpfee_1;
  const_string local_30d8 [2];
  lazy_ostream local_30b8 [2];
  assertion_result local_3098 [2];
  lazy_ostream local_3060;
  undefined1 local_3050 [16];
  undefined1 local_3040 [64];
  const_string local_3000 [2];
  lazy_ostream local_2fe0 [2];
  assertion_result local_2fc0 [2];
  const_string local_2f88 [2];
  lazy_ostream local_2f68 [2];
  assertion_result local_2f48 [2];
  CFeeRate just_below_tx4;
  lazy_ostream local_2f08;
  undefined1 local_2ef0 [64];
  const_string local_2eb0 [2];
  lazy_ostream local_2e90 [2];
  assertion_result local_2e70 [2];
  const_string local_2e38 [2];
  lazy_ostream local_2e18 [2];
  assertion_result local_2df8 [2];
  const_string local_2dc0 [2];
  lazy_ostream local_2da0 [2];
  assertion_result local_2d80 [3];
  lazy_ostream local_2d28;
  undefined1 local_2d10 [64];
  const_string local_2cd0 [2];
  lazy_ostream local_2cb0 [2];
  assertion_result local_2c90 [2];
  const_string local_2c58 [2];
  lazy_ostream local_2c38 [2];
  assertion_result local_2c18 [2];
  const_string local_2be0 [2];
  lazy_ostream local_2bc0 [2];
  assertion_result local_2ba0 [3];
  lazy_ostream local_2b48;
  undefined1 local_2b30 [64];
  const_string local_2af0 [2];
  lazy_ostream local_2ad0 [2];
  _Base_ptr local_2ab0;
  assertion_result local_2aa8 [2];
  iterator tx7_bumpfee;
  lazy_ostream local_2a68;
  undefined1 local_2a50 [64];
  const_string local_2a10 [2];
  lazy_ostream local_29f0 [2];
  _Base_ptr local_29d0;
  assertion_result local_29c8 [2];
  iterator tx6_bumpfee;
  lazy_ostream local_2988;
  undefined1 local_2970 [64];
  const_string local_2930 [2];
  lazy_ostream local_2910 [2];
  _Base_ptr local_28f0;
  assertion_result local_28e8 [2];
  iterator tx3_bumpfee;
  lazy_ostream local_28a8;
  undefined1 local_2890 [64];
  const_string local_2850 [2];
  lazy_ostream local_2830 [2];
  _Base_ptr local_2810;
  assertion_result local_2808 [2];
  iterator tx0_bumpfee;
  const_string local_27c8 [2];
  lazy_ostream local_27a8 [2];
  assertion_result local_2788 [2];
  const_string local_2750 [2];
  lazy_ostream local_2730 [2];
  assertion_result local_2710 [2];
  lazy_ostream local_26d8;
  undefined1 local_26c8 [16];
  undefined1 local_26b8 [64];
  const_string local_2678 [2];
  lazy_ostream local_2658 [2];
  assertion_result local_2638 [2];
  const_string local_2600 [2];
  lazy_ostream local_25e0 [2];
  assertion_result local_25c0 [2];
  CFeeRate very_high_feerate;
  const_string local_2580 [2];
  lazy_ostream local_2560 [2];
  assertion_result local_2540 [2];
  const_string local_2508 [2];
  lazy_ostream local_24e8 [2];
  assertion_result local_24c8 [2];
  const_string local_2490 [2];
  lazy_ostream local_2470 [2];
  CAmount local_2450;
  assertion_result local_2440 [2];
  CTxMemPoolEntry *local_2408;
  undefined8 local_2400;
  CFeeRate tx7_anc_feerate;
  const_string local_23f0 [2];
  lazy_ostream local_23d0 [2];
  CAmount local_23b0;
  assertion_result local_23a0 [2];
  CTxMemPoolEntry *local_2368;
  undefined8 local_2360;
  CFeeRate tx6_anc_feerate;
  CFeeRate tx4_feerate;
  const_string local_2348 [2];
  lazy_ostream local_2328 [2];
  CAmount local_2308;
  assertion_result local_22f8 [2];
  CTxMemPoolEntry *local_22c0;
  undefined8 local_22b8;
  CFeeRate tx3_anc_feerate;
  const_string local_22a8 [2];
  lazy_ostream local_2288 [2];
  assertion_result local_2268 [2];
  CFeeRate tx3_feerate;
  CFeeRate tx2_feerate;
  const_string local_2220 [2];
  lazy_ostream local_2200 [2];
  assertion_result local_21e0 [2];
  iterator __end1_1;
  iterator __begin1_1;
  vector<COutPoint,_std::allocator<COutPoint>_> all_unspent_outpoints;
  iterator __end1;
  iterator __begin1;
  vector<long,_std::allocator<long>_> tx_vsizes;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  all_transactions;
  CTransactionRef tx7;
  CTransactionRef tx6;
  CTransactionRef tx5;
  CTransactionRef tx4;
  CTransactionRef tx3;
  CTransactionRef tx2;
  CTransactionRef tx1;
  CTransactionRef tx0;
  TestMemPoolEntryHelper entry;
  optional<long> tx6_tx7_bumpfee_1;
  optional<long> tx6_tx7_bumpfee;
  optional<long> tx3_bump_fee;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  undefined1 local_1e98 [96];
  MiniMiner miniminer_pool;
  MiniMiner miniminer_manual;
  undefined1 local_1808 [88];
  map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
  descendant_caches;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  bump_fees_2;
  MiniMiner mini_miner_2;
  MiniMiner mini_miner_tx6_tx7_1;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  bump_fees_1;
  MiniMiner mini_miner_1;
  MiniMiner mini_miner_tx6_tx7;
  MiniMiner mini_miner_total_tx3;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  bump_fees;
  MiniMiner mini_miner;
  undefined1 local_a90 [128];
  undefined1 local_a10 [2568];
  long local_8;
  
  local_3000[0].m_begin = (iterator)0x0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_ffffffffffffb228,
             (char *)in_stack_ffffffffffffb220,in_stack_ffffffffffffb21c,
             (char *)in_stack_ffffffffffffb210,
             (char *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208));
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_ffffffffffffb1f8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb1e8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffb228,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb220,
             (char *)CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
             (char *)in_stack_ffffffffffffb210,in_stack_ffffffffffffb20c,
             SUB41((uint)in_stack_ffffffffffffb208 >> 0x18,0));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb1e8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffb228,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffb220,
             (char *)CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
             (char *)in_stack_ffffffffffffb210,in_stack_ffffffffffffb20c,
             SUB41((uint)in_stack_ffffffffffffb208 >> 0x18,0));
  TestMemPoolEntryHelper::TestMemPoolEntryHelper
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb1e8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffb1f8,(size_type)in_stack_ffffffffffffb1f0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  __l._M_array._4_4_ = in_stack_ffffffffffffb234;
  __l._M_array._0_4_ = in_stack_ffffffffffffb230;
  __l._M_len = (size_type)in_stack_ffffffffffffb238;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb228,__l,
             (allocator_type *)in_stack_ffffffffffffb220);
  make_tx((vector<COutPoint,_std::allocator<COutPoint>_> *)
          CONCAT44(in_stack_ffffffffffffb25c,in_stack_ffffffffffffb258),in_stack_ffffffffffffb250);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb1f8);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb1f8,(CAmount)in_stack_ffffffffffffb1f0)
  ;
  TestMemPoolEntryHelper::FromTx
            (in_stack_ffffffffffffb240,(CTransactionRef *)in_stack_ffffffffffffb238);
  CTxMemPool::addUnchecked(in_stack_ffffffffffffb228,in_stack_ffffffffffffb220);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb1e8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffb1f8,(size_type)in_stack_ffffffffffffb1f0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  __l_00._M_array._4_4_ = in_stack_ffffffffffffb234;
  __l_00._M_array._0_4_ = in_stack_ffffffffffffb230;
  __l_00._M_len = (size_type)in_stack_ffffffffffffb238;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb228,__l_00,
             (allocator_type *)in_stack_ffffffffffffb220);
  make_tx((vector<COutPoint,_std::allocator<COutPoint>_> *)
          CONCAT44(in_stack_ffffffffffffb25c,in_stack_ffffffffffffb258),in_stack_ffffffffffffb250);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb1f8);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb1f8,(CAmount)in_stack_ffffffffffffb1f0)
  ;
  TestMemPoolEntryHelper::FromTx
            (in_stack_ffffffffffffb240,(CTransactionRef *)in_stack_ffffffffffffb238);
  CTxMemPool::addUnchecked(in_stack_ffffffffffffb228,in_stack_ffffffffffffb220);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb1e8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffb1f8,(size_type)in_stack_ffffffffffffb1f0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  __l_01._M_array._4_4_ = in_stack_ffffffffffffb234;
  __l_01._M_array._0_4_ = in_stack_ffffffffffffb230;
  __l_01._M_len = (size_type)in_stack_ffffffffffffb238;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb228,__l_01,
             (allocator_type *)in_stack_ffffffffffffb220);
  make_tx((vector<COutPoint,_std::allocator<COutPoint>_> *)
          CONCAT44(in_stack_ffffffffffffb25c,in_stack_ffffffffffffb258),in_stack_ffffffffffffb250);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb1f8);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb1f8,(CAmount)in_stack_ffffffffffffb1f0)
  ;
  TestMemPoolEntryHelper::FromTx
            (in_stack_ffffffffffffb240,(CTransactionRef *)in_stack_ffffffffffffb238);
  CTxMemPool::addUnchecked(in_stack_ffffffffffffb228,in_stack_ffffffffffffb220);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  __l_02._M_array._4_4_ = in_stack_ffffffffffffb234;
  __l_02._M_array._0_4_ = in_stack_ffffffffffffb230;
  __l_02._M_len = (size_type)in_stack_ffffffffffffb238;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb228,__l_02,
             (allocator_type *)in_stack_ffffffffffffb220);
  make_tx((vector<COutPoint,_std::allocator<COutPoint>_> *)
          CONCAT44(in_stack_ffffffffffffb25c,in_stack_ffffffffffffb258),in_stack_ffffffffffffb250);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb1f8);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb1f8,(CAmount)in_stack_ffffffffffffb1f0)
  ;
  TestMemPoolEntryHelper::FromTx
            (in_stack_ffffffffffffb240,(CTransactionRef *)in_stack_ffffffffffffb238);
  CTxMemPool::addUnchecked(in_stack_ffffffffffffb228,in_stack_ffffffffffffb220);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb1e8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffb1f8,(size_type)in_stack_ffffffffffffb1f0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  __l_03._M_array._4_4_ = in_stack_ffffffffffffb234;
  __l_03._M_array._0_4_ = in_stack_ffffffffffffb230;
  __l_03._M_len = (size_type)in_stack_ffffffffffffb238;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb228,__l_03,
             (allocator_type *)in_stack_ffffffffffffb220);
  make_tx((vector<COutPoint,_std::allocator<COutPoint>_> *)
          CONCAT44(in_stack_ffffffffffffb25c,in_stack_ffffffffffffb258),in_stack_ffffffffffffb250);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb1f8);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb1f8,(CAmount)in_stack_ffffffffffffb1f0)
  ;
  TestMemPoolEntryHelper::FromTx
            (in_stack_ffffffffffffb240,(CTransactionRef *)in_stack_ffffffffffffb238);
  CTxMemPool::addUnchecked(in_stack_ffffffffffffb228,in_stack_ffffffffffffb220);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  __l_04._M_array._4_4_ = in_stack_ffffffffffffb234;
  __l_04._M_array._0_4_ = in_stack_ffffffffffffb230;
  __l_04._M_len = (size_type)in_stack_ffffffffffffb238;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb228,__l_04,
             (allocator_type *)in_stack_ffffffffffffb220);
  make_tx((vector<COutPoint,_std::allocator<COutPoint>_> *)
          CONCAT44(in_stack_ffffffffffffb25c,in_stack_ffffffffffffb258),in_stack_ffffffffffffb250);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb1f8);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb1f8,(CAmount)in_stack_ffffffffffffb1f0)
  ;
  TestMemPoolEntryHelper::FromTx
            (in_stack_ffffffffffffb240,(CTransactionRef *)in_stack_ffffffffffffb238);
  CTxMemPool::addUnchecked(in_stack_ffffffffffffb228,in_stack_ffffffffffffb220);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  __l_05._M_array._4_4_ = in_stack_ffffffffffffb234;
  __l_05._M_array._0_4_ = in_stack_ffffffffffffb230;
  __l_05._M_len = (size_type)in_stack_ffffffffffffb238;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb228,__l_05,
             (allocator_type *)in_stack_ffffffffffffb220);
  make_tx((vector<COutPoint,_std::allocator<COutPoint>_> *)
          CONCAT44(in_stack_ffffffffffffb25c,in_stack_ffffffffffffb258),in_stack_ffffffffffffb250);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb1f8);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb1f8,(CAmount)in_stack_ffffffffffffb1f0)
  ;
  TestMemPoolEntryHelper::FromTx
            (in_stack_ffffffffffffb240,(CTransactionRef *)in_stack_ffffffffffffb238);
  CTxMemPool::addUnchecked(in_stack_ffffffffffffb228,in_stack_ffffffffffffb220);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  __l_06._M_array._4_4_ = in_stack_ffffffffffffb234;
  __l_06._M_array._0_4_ = in_stack_ffffffffffffb230;
  __l_06._M_len = (size_type)in_stack_ffffffffffffb238;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb228,__l_06,
             (allocator_type *)in_stack_ffffffffffffb220);
  make_tx((vector<COutPoint,_std::allocator<COutPoint>_> *)
          CONCAT44(in_stack_ffffffffffffb25c,in_stack_ffffffffffffb258),in_stack_ffffffffffffb250);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb1f8);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffb1f8,(CAmount)in_stack_ffffffffffffb1f0)
  ;
  TestMemPoolEntryHelper::FromTx
            (in_stack_ffffffffffffb240,(CTransactionRef *)in_stack_ffffffffffffb238);
  CTxMemPool::addUnchecked(in_stack_ffffffffffffb228,in_stack_ffffffffffffb220);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffb1e8);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffb1e8,
             (shared_ptr<const_CTransaction> *)0x75b5de);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffb1e8,
             (shared_ptr<const_CTransaction> *)0x75b5f3);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffb1e8,
             (shared_ptr<const_CTransaction> *)0x75b608);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffb1e8,
             (shared_ptr<const_CTransaction> *)0x75b61d);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffb1e8,
             (shared_ptr<const_CTransaction> *)0x75b632);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffb1e8,
             (shared_ptr<const_CTransaction> *)0x75b647);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffb1e8,
             (shared_ptr<const_CTransaction> *)0x75b65c);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffb1e8,
             (shared_ptr<const_CTransaction> *)0x75b671);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffb1e8);
  __l_07._M_array._4_4_ = in_stack_ffffffffffffb234;
  __l_07._M_array._0_4_ = in_stack_ffffffffffffb230;
  __l_07._M_len = (size_type)in_stack_ffffffffffffb238;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_ffffffffffffb228,__l_07,(allocator_type *)in_stack_ffffffffffffb220);
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffb1e8);
  local_4008 = local_a10;
  do {
    local_4008 = local_4008 + -0x10;
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffb1e8);
  } while (local_4008 != local_a90);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1e8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *)in_stack_ffffffffffffb1e8);
  std::vector<long,_std::allocator<long>_>::reserve
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb228,
             (size_type)in_stack_ffffffffffffb220);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)in_stack_ffffffffffffb1f0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         *)in_stack_ffffffffffffb1f0);
  while (bVar7 = __gnu_cxx::
                 operator==<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                           ((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)in_stack_ffffffffffffb1f8,
                            (__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)in_stack_ffffffffffffb1f0), ((bVar7 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator*((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                 *)in_stack_ffffffffffffb1e8);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              in_stack_ffffffffffffb1f8);
    GetVirtualTransactionSize((CTransaction *)in_stack_ffffffffffffb1e8);
    std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1e8,
               (value_type_conflict6 *)0x75b811);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                  *)in_stack_ffffffffffffb1e8);
  }
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  __l_08._M_array._4_4_ = in_stack_ffffffffffffb234;
  __l_08._M_array._0_4_ = in_stack_ffffffffffffb230;
  __l_08._M_len = (size_type)in_stack_ffffffffffffb238;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb228,__l_08,
             (allocator_type *)in_stack_ffffffffffffb220);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::begin
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb1f0);
  __end1_1 = std::vector<COutPoint,_std::allocator<COutPoint>_>::end
                       ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb1f0);
  while (bVar7 = __gnu_cxx::
                 operator==<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                           ((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                             *)in_stack_ffffffffffffb1f8,
                            (__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                             *)in_stack_ffffffffffffb1f0), ((bVar7 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>::
    operator*((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_> *
              )in_stack_ffffffffffffb1e8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
                 (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffb228,
                 (const_string *)in_stack_ffffffffffffb220,
                 CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
                 (const_string *)in_stack_ffffffffffffb210);
      CTxMemPool::isSpent((CTxMemPool *)
                          CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
                          in_stack_ffffffffffffb210);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffb1f8,
                 SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
                 (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
                 (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
      in_stack_ffffffffffffb1e8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_21e0,local_2200,local_2220,0x1bb,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffb1e8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffb1e8);
      bVar7 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar7);
    __gnu_cxx::__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>::
    operator++((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                *)in_stack_ffffffffffffb1e8);
  }
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                     (CAmount *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200),
                     (uint32_t)((ulong)in_stack_ffffffffffffb1f8 >> 0x20));
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                     (CAmount *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200),
                     (uint32_t)((ulong)in_stack_ffffffffffffb1f8 >> 0x20));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    operator>((CFeeRate *)in_stack_ffffffffffffb1f8,(CFeeRate *)in_stack_ffffffffffffb1f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2268,local_2288,local_22a8,0x1c0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  local_22b8 = 0x322bc;
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                     (CAmount *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200),
                     (uint32_t)((ulong)in_stack_ffffffffffffb1f8 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  local_22c0 = CTxMemPool::GetEntry
                         ((CTxMemPool *)
                          CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                          (Txid *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200));
  inline_assertion_check<true,CTxMemPoolEntry_const*>
            ((CTxMemPoolEntry **)in_stack_ffffffffffffb228,(char *)in_stack_ffffffffffffb220,
             in_stack_ffffffffffffb21c,(char *)in_stack_ffffffffffffb210,
             (char *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    local_2308 = CTxMemPoolEntry::GetModFeesWithAncestors
                           ((CTxMemPoolEntry *)in_stack_ffffffffffffb1e8);
    CTxMemPoolEntry::GetSizeWithAncestors((CTxMemPoolEntry *)in_stack_ffffffffffffb1e8);
    CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                       (CAmount *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200),
                       (uint32_t)((ulong)in_stack_ffffffffffffb1f8 >> 0x20));
    ::operator==((CFeeRate *)in_stack_ffffffffffffb1f8,(CFeeRate *)in_stack_ffffffffffffb1f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_22f8,local_2328,local_2348,0x1c3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                     (CAmount *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200),
                     (uint32_t)((ulong)in_stack_ffffffffffffb1f8 >> 0x20));
  local_2360 = 0x19c1c;
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                     (CAmount *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200),
                     (uint32_t)((ulong)in_stack_ffffffffffffb1f8 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  local_2368 = CTxMemPool::GetEntry
                         ((CTxMemPool *)
                          CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                          (Txid *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200));
  inline_assertion_check<true,CTxMemPoolEntry_const*>
            ((CTxMemPoolEntry **)in_stack_ffffffffffffb228,(char *)in_stack_ffffffffffffb220,
             in_stack_ffffffffffffb21c,(char *)in_stack_ffffffffffffb210,
             (char *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    local_23b0 = CTxMemPoolEntry::GetModFeesWithAncestors
                           ((CTxMemPoolEntry *)in_stack_ffffffffffffb1e8);
    CTxMemPoolEntry::GetSizeWithAncestors((CTxMemPoolEntry *)in_stack_ffffffffffffb1e8);
    CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                       (CAmount *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200),
                       (uint32_t)((ulong)in_stack_ffffffffffffb1f8 >> 0x20));
    ::operator==((CFeeRate *)in_stack_ffffffffffffb1f8,(CFeeRate *)in_stack_ffffffffffffb1f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_23a0,local_23d0,local_23f0,0x1c7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  local_2400 = 0x30f34;
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                     (CAmount *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200),
                     (uint32_t)((ulong)in_stack_ffffffffffffb1f8 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  local_2408 = CTxMemPool::GetEntry
                         ((CTxMemPool *)
                          CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                          (Txid *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200));
  inline_assertion_check<true,CTxMemPoolEntry_const*>
            ((CTxMemPoolEntry **)in_stack_ffffffffffffb228,(char *)in_stack_ffffffffffffb220,
             in_stack_ffffffffffffb21c,(char *)in_stack_ffffffffffffb210,
             (char *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    local_2450 = CTxMemPoolEntry::GetModFeesWithAncestors
                           ((CTxMemPoolEntry *)in_stack_ffffffffffffb1e8);
    CTxMemPoolEntry::GetSizeWithAncestors((CTxMemPoolEntry *)in_stack_ffffffffffffb1e8);
    CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                       (CAmount *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200),
                       (uint32_t)((ulong)in_stack_ffffffffffffb1f8 >> 0x20));
    ::operator==((CFeeRate *)in_stack_ffffffffffffb1f8,(CFeeRate *)in_stack_ffffffffffffb1f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2440,local_2470,local_2490,0x1ca,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    operator>((CFeeRate *)in_stack_ffffffffffffb1f8,(CFeeRate *)in_stack_ffffffffffffb1f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_24c8,local_24e8,local_2508,0x1cb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    operator>((CFeeRate *)in_stack_ffffffffffffb1f8,(CFeeRate *)in_stack_ffffffffffffb1f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2540,local_2560,local_2580,0x1cc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  ::node::MiniMiner::MiniMiner
            (in_stack_ffffffffffffb578,in_stack_ffffffffffffb570,in_stack_ffffffffffffb568);
  CFeeRate::CFeeRate<long>((CFeeRate *)in_stack_ffffffffffffb1e8,0x75d191);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    ::operator<((CFeeRate *)in_stack_ffffffffffffb1f8,(CFeeRate *)in_stack_ffffffffffffb1f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_25c0,local_25e0,local_2600,0x1d2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2638,local_2658,local_2678,0x1d3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  ::node::MiniMiner::CalculateBumpFees
            (in_stack_ffffffffffffb288,
             (CFeeRate *)CONCAT44(in_stack_ffffffffffffb284,in_stack_ffffffffffffb280));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    local_26d8._8_8_ =
         std::
         map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
         ::size((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                 *)in_stack_ffffffffffffb1e8);
    local_26d8._vptr_lazy_ostream =
         (_func_int **)
         std::vector<COutPoint,_std::allocator<COutPoint>_>::size
                   ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1f8 = "all_unspent_outpoints.size()";
    in_stack_ffffffffffffb1f0 = &local_26d8;
    in_stack_ffffffffffffb1e8 = "bump_fees.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_26b8,local_26c8,0x1d5,1,2,&local_26d8.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2710,local_2730,local_2750,0x1d6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    sanity_check((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)CONCAT44(in_stack_ffffffffffffb284,in_stack_ffffffffffffb280),
                 in_stack_ffffffffffffb278);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2788,local_27a8,local_27c8,0x1d7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  tx0_bumpfee = std::
                map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                ::find((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                        *)in_stack_ffffffffffffb1f0,(key_type *)in_stack_ffffffffffffb1e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    local_2810 = (_Base_ptr)
                 std::
                 map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                 ::end((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                        *)in_stack_ffffffffffffb1f0);
    std::operator==((_Self *)in_stack_ffffffffffffb1f8,(_Self *)in_stack_ffffffffffffb1f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2808,local_2830,local_2850,0x1d9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_COutPoint,_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_COutPoint,_long>_> *)
                        in_stack_ffffffffffffb1e8);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    CVar9 = CFeeRate::GetFee((CFeeRate *)
                             CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                             in_stack_ffffffffffffb204);
    local_28a8._vptr_lazy_ostream = (_func_int **)(CVar9 + -500);
    in_stack_ffffffffffffb1f8 = "very_high_feerate.GetFee(tx_vsizes[0]) - low_fee";
    in_stack_ffffffffffffb1f0 = &local_28a8;
    in_stack_ffffffffffffb1e8 = "tx0_bumpfee->second";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_2890,&local_28a8.m_empty,0x1da,1,2,&ppVar8->second);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  tx3_bumpfee = std::
                map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                ::find((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                        *)in_stack_ffffffffffffb1f0,(key_type *)in_stack_ffffffffffffb1e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    local_28f0 = (_Base_ptr)
                 std::
                 map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                 ::end((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                        *)in_stack_ffffffffffffb1f0);
    std::operator==((_Self *)in_stack_ffffffffffffb1f8,(_Self *)in_stack_ffffffffffffb1f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_28e8,local_2910,local_2930,0x1dc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_COutPoint,_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_COutPoint,_long>_> *)
                        in_stack_ffffffffffffb1e8);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    CVar9 = CFeeRate::GetFee((CFeeRate *)
                             CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                             in_stack_ffffffffffffb204);
    local_2988._vptr_lazy_ostream = (_func_int **)(CVar9 + -0x322bc);
    in_stack_ffffffffffffb1f8 =
         "very_high_feerate.GetFee(tx_vsizes[0] + tx_vsizes[1] + tx_vsizes[2] + tx_vsizes[3]) - (low_fee + med_fee + high_fee + high_fee)"
    ;
    in_stack_ffffffffffffb1f0 = &local_2988;
    in_stack_ffffffffffffb1e8 = "tx3_bumpfee->second";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_2970,&local_2988.m_empty,0x1de,1,2,&ppVar8->second);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  tx6_bumpfee = std::
                map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                ::find((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                        *)in_stack_ffffffffffffb1f0,(key_type *)in_stack_ffffffffffffb1e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    local_29d0 = (_Base_ptr)
                 std::
                 map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                 ::end((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                        *)in_stack_ffffffffffffb1f0);
    std::operator==((_Self *)in_stack_ffffffffffffb1f8,(_Self *)in_stack_ffffffffffffb1f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_29c8,local_29f0,local_2a10,0x1e0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_COutPoint,_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_COutPoint,_long>_> *)
                        in_stack_ffffffffffffb1e8);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    CVar9 = CFeeRate::GetFee((CFeeRate *)
                             CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                             in_stack_ffffffffffffb204);
    local_2a68._vptr_lazy_ostream = (_func_int **)(CVar9 + -0x19c1c);
    in_stack_ffffffffffffb1f8 =
         "very_high_feerate.GetFee(tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[6]) - (high_fee + low_fee + med_fee)"
    ;
    in_stack_ffffffffffffb1f0 = &local_2a68;
    in_stack_ffffffffffffb1e8 = "tx6_bumpfee->second";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_2a50,&local_2a68.m_empty,0x1e2,1,2,&ppVar8->second);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  tx7_bumpfee = std::
                map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                ::find((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                        *)in_stack_ffffffffffffb1f0,(key_type *)in_stack_ffffffffffffb1e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    local_2ab0 = (_Base_ptr)
                 std::
                 map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                 ::end((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                        *)in_stack_ffffffffffffb1f0);
    std::operator==((_Self *)in_stack_ffffffffffffb1f8,(_Self *)in_stack_ffffffffffffb1f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2aa8,local_2ad0,local_2af0,0x1e4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_COutPoint,_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_COutPoint,_long>_> *)
                        in_stack_ffffffffffffb1e8);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    CVar9 = CFeeRate::GetFee((CFeeRate *)
                             CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                             in_stack_ffffffffffffb204);
    local_2b48._vptr_lazy_ostream = (_func_int **)(CVar9 + -0x30f34);
    in_stack_ffffffffffffb1f8 =
         "very_high_feerate.GetFee(tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[7]) - (high_fee + low_fee + high_fee)"
    ;
    in_stack_ffffffffffffb1f0 = &local_2b48;
    in_stack_ffffffffffffb1e8 = "tx7_bumpfee->second";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_2b30,&local_2b48.m_empty,0x1e6,1,2,&ppVar8->second);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  __l_09._M_array._4_4_ = in_stack_ffffffffffffb234;
  __l_09._M_array._0_4_ = in_stack_ffffffffffffb230;
  __l_09._M_len = (size_type)in_stack_ffffffffffffb238;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb228,__l_09,
             (allocator_type *)in_stack_ffffffffffffb220);
  ::node::MiniMiner::MiniMiner
            (in_stack_ffffffffffffb578,in_stack_ffffffffffffb570,in_stack_ffffffffffffb568);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb1f8);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2ba0,local_2bc0,local_2be0,0x1e9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  ::node::MiniMiner::CalculateTotalBumpFees(in_stack_ffffffffffffb370,in_stack_ffffffffffffb368);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2c18,local_2c38,local_2c58,0x1eb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    std::optional<long>::has_value((optional<long> *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2c90,local_2cb0,local_2cd0,0x1ec,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    plVar10 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffb1f8);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    CVar9 = CFeeRate::GetFee((CFeeRate *)
                             CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                             in_stack_ffffffffffffb204);
    local_2d28._vptr_lazy_ostream = (_func_int **)(CVar9 + -0x322bc);
    in_stack_ffffffffffffb1f8 =
         "very_high_feerate.GetFee(tx_vsizes[0] + tx_vsizes[1] + tx_vsizes[2] + tx_vsizes[3]) - (low_fee + med_fee + high_fee + high_fee)"
    ;
    in_stack_ffffffffffffb1f0 = &local_2d28;
    in_stack_ffffffffffffb1e8 = "tx3_bump_fee.value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_2d10,&local_2d28.m_empty,0x1ee,1,2,plVar10);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  __l_10._M_array._4_4_ = in_stack_ffffffffffffb234;
  __l_10._M_array._0_4_ = in_stack_ffffffffffffb230;
  __l_10._M_len = (size_type)in_stack_ffffffffffffb238;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb228,__l_10,
             (allocator_type *)in_stack_ffffffffffffb220);
  ::node::MiniMiner::MiniMiner
            (in_stack_ffffffffffffb578,in_stack_ffffffffffffb570,in_stack_ffffffffffffb568);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb1f8);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2d80,local_2da0,local_2dc0,0x1f1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  ::node::MiniMiner::CalculateTotalBumpFees(in_stack_ffffffffffffb370,in_stack_ffffffffffffb368);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2df8,local_2e18,local_2e38,499,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    std::optional<long>::has_value((optional<long> *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2e70,local_2e90,local_2eb0,500,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    plVar10 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffb1f8);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    CVar9 = CFeeRate::GetFee((CFeeRate *)
                             CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                             in_stack_ffffffffffffb204);
    local_2f08._vptr_lazy_ostream = (_func_int **)(CVar9 + -0x322bc);
    in_stack_ffffffffffffb1f8 =
         "very_high_feerate.GetFee(tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[6] + tx_vsizes[7]) - (high_fee + low_fee + med_fee + high_fee)"
    ;
    in_stack_ffffffffffffb1f0 = &local_2f08;
    in_stack_ffffffffffffb1e8 = "tx6_tx7_bumpfee.value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_2ef0,&local_2f08.m_empty,0x1f6,1,2,plVar10);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  ::node::MiniMiner::~MiniMiner((MiniMiner *)in_stack_ffffffffffffb1e8);
  ::node::MiniMiner::~MiniMiner((MiniMiner *)in_stack_ffffffffffffb1e8);
  std::
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>::
  ~map((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
        *)in_stack_ffffffffffffb1e8);
  ::node::MiniMiner::~MiniMiner((MiniMiner *)in_stack_ffffffffffffb1e8);
  CFeeRate::GetFeePerK((CFeeRate *)in_stack_ffffffffffffb1e8);
  CFeeRate::CFeeRate<long>((CFeeRate *)in_stack_ffffffffffffb1e8,0x75f69f);
  ::node::MiniMiner::MiniMiner
            (in_stack_ffffffffffffb578,in_stack_ffffffffffffb570,in_stack_ffffffffffffb568);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2f48,local_2f68,local_2f88,0x1fc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  ::node::MiniMiner::CalculateBumpFees
            (in_stack_ffffffffffffb288,
             (CFeeRate *)CONCAT44(in_stack_ffffffffffffb284,in_stack_ffffffffffffb280));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2fc0,local_2fe0,local_3000,0x1fe,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    local_3060._8_8_ =
         std::
         map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
         ::size((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                 *)in_stack_ffffffffffffb1e8);
    local_3060._vptr_lazy_ostream =
         (_func_int **)
         std::vector<COutPoint,_std::allocator<COutPoint>_>::size
                   ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1f8 = "all_unspent_outpoints.size()";
    in_stack_ffffffffffffb1f0 = &local_3060;
    in_stack_ffffffffffffb1e8 = "bump_fees.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_3040,local_3050,0x1ff,1,2,&local_3060.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    sanity_check((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)CONCAT44(in_stack_ffffffffffffb284,in_stack_ffffffffffffb280),
                 in_stack_ffffffffffffb278);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3098,local_30b8,local_30d8,0x200,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  tx6_bumpfee_1 =
       std::
       map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
       ::find((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
               *)in_stack_ffffffffffffb1f0,(key_type *)in_stack_ffffffffffffb1e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    local_3120 = (_Base_ptr)
                 std::
                 map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                 ::end((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                        *)in_stack_ffffffffffffb1f0);
    std::operator==((_Self *)in_stack_ffffffffffffb1f8,(_Self *)in_stack_ffffffffffffb1f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3118,local_3140,local_3160,0x202,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_COutPoint,_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_COutPoint,_long>_> *)
                        in_stack_ffffffffffffb1e8);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    CVar9 = CFeeRate::GetFee((CFeeRate *)
                             CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                             in_stack_ffffffffffffb204);
    local_31b8._vptr_lazy_ostream = (_func_int **)(CVar9 + -0x157c);
    in_stack_ffffffffffffb1f8 =
         "just_below_tx4.GetFee(tx_vsizes[5] + tx_vsizes[6]) - (low_fee + med_fee)";
    in_stack_ffffffffffffb1f0 = &local_31b8;
    in_stack_ffffffffffffb1e8 = "tx6_bumpfee->second";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_31a0,&local_31b8.m_empty,0x203,1,2,&ppVar8->second);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  tx7_bumpfee_1 =
       std::
       map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
       ::find((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
               *)in_stack_ffffffffffffb1f0,(key_type *)in_stack_ffffffffffffb1e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    local_3200 = (_Base_ptr)
                 std::
                 map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                 ::end((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                        *)in_stack_ffffffffffffb1f0);
    std::operator==((_Self *)in_stack_ffffffffffffb1f8,(_Self *)in_stack_ffffffffffffb1f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_31f8,local_3220,local_3240,0x205,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_COutPoint,_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_COutPoint,_long>_> *)
                        in_stack_ffffffffffffb1e8);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    CVar9 = CFeeRate::GetFee((CFeeRate *)
                             CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                             in_stack_ffffffffffffb204);
    local_3298._vptr_lazy_ostream = (_func_int **)(CVar9 + -0x18894);
    in_stack_ffffffffffffb1f8 =
         "just_below_tx4.GetFee(tx_vsizes[5] + tx_vsizes[7]) - (low_fee + high_fee)";
    in_stack_ffffffffffffb1f0 = &local_3298;
    in_stack_ffffffffffffb1e8 = "tx7_bumpfee->second";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_3280,&local_3298.m_empty,0x206,1,2,&ppVar8->second);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  __l_11._M_array._4_4_ = in_stack_ffffffffffffb234;
  __l_11._M_array._0_4_ = in_stack_ffffffffffffb230;
  __l_11._M_len = (size_type)in_stack_ffffffffffffb238;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb228,__l_11,
             (allocator_type *)in_stack_ffffffffffffb220);
  ::node::MiniMiner::MiniMiner
            (in_stack_ffffffffffffb578,in_stack_ffffffffffffb570,in_stack_ffffffffffffb568);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb1f8);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffb1e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_32f0,local_3310,local_3330,0x209,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  ::node::MiniMiner::CalculateTotalBumpFees(in_stack_ffffffffffffb370,in_stack_ffffffffffffb368);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3368,local_3388,local_33a8,0x20b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    std::optional<long>::has_value((optional<long> *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_33e0,local_3400,local_3420,0x20c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    plVar10 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffb1f8);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    CVar9 = CFeeRate::GetFee((CFeeRate *)
                             CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                             in_stack_ffffffffffffb204);
    local_3478._vptr_lazy_ostream = (_func_int **)(CVar9 + -0x157c);
    in_stack_ffffffffffffb1f8 =
         "just_below_tx4.GetFee(tx_vsizes[5] + tx_vsizes[6]) - (low_fee + med_fee)";
    in_stack_ffffffffffffb1f0 = &local_3478;
    in_stack_ffffffffffffb1e8 = "tx6_tx7_bumpfee.value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_3460,&local_3478.m_empty,0x20d,1,2,plVar10);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  ::node::MiniMiner::~MiniMiner((MiniMiner *)in_stack_ffffffffffffb1e8);
  std::
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>::
  ~map((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
        *)in_stack_ffffffffffffb1e8);
  ::node::MiniMiner::~MiniMiner((MiniMiner *)in_stack_ffffffffffffb1e8);
  local_3488 = 0x1392;
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                     (CAmount *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200),
                     (uint32_t)((ulong)in_stack_ffffffffffffb1f8 >> 0x20));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    local_34d0 = 0x18894;
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                       (CAmount *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200),
                       (uint32_t)((ulong)in_stack_ffffffffffffb1f8 >> 0x20));
    operator<=((CFeeRate *)in_stack_ffffffffffffb1f8,(CFeeRate *)in_stack_ffffffffffffb1f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_34c0,local_34f0,local_3510,0x212,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  ::node::MiniMiner::MiniMiner
            (in_stack_ffffffffffffb578,in_stack_ffffffffffffb570,in_stack_ffffffffffffb568);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3548,local_3568,local_3588,0x214,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  ::node::MiniMiner::CalculateBumpFees
            (in_stack_ffffffffffffb288,
             (CFeeRate *)CONCAT44(in_stack_ffffffffffffb284,in_stack_ffffffffffffb280));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_35c0,local_35e0,local_3600,0x216,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    local_3660._8_8_ =
         std::
         map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
         ::size((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                 *)in_stack_ffffffffffffb1e8);
    local_3660._vptr_lazy_ostream =
         (_func_int **)
         std::vector<COutPoint,_std::allocator<COutPoint>_>::size
                   ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1f8 = "all_unspent_outpoints.size()";
    in_stack_ffffffffffffb1f0 = &local_3660;
    in_stack_ffffffffffffb1e8 = "bump_fees.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_3640,local_3650,0x217,1,2,&local_3660.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    sanity_check((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)CONCAT44(in_stack_ffffffffffffb284,in_stack_ffffffffffffb280),
                 in_stack_ffffffffffffb278);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3698,local_36b8,local_36d8,0x218,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  tx6_bumpfee_2 =
       std::
       map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
       ::find((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
               *)in_stack_ffffffffffffb1f0,(key_type *)in_stack_ffffffffffffb1e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    local_3720 = (_Base_ptr)
                 std::
                 map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                 ::end((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                        *)in_stack_ffffffffffffb1f0);
    std::operator==((_Self *)in_stack_ffffffffffffb1f8,(_Self *)in_stack_ffffffffffffb1f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3718,local_3740,local_3760,0x21a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_COutPoint,_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_COutPoint,_long>_> *)
                        in_stack_ffffffffffffb1e8);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
               (size_type)in_stack_ffffffffffffb1f0);
    CVar9 = CFeeRate::GetFee((CFeeRate *)
                             CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
                             in_stack_ffffffffffffb204);
    local_37b8._vptr_lazy_ostream = (_func_int **)(CVar9 + -5000);
    in_stack_ffffffffffffb1f8 = "just_above_tx6.GetFee(tx_vsizes[6]) - (med_fee)";
    in_stack_ffffffffffffb1f0 = &local_37b8;
    in_stack_ffffffffffffb1e8 = "tx6_bumpfee->second";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_37a0,&local_37b8.m_empty,0x21b,1,2,&ppVar8->second);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffb1f8,(Txid *)in_stack_ffffffffffffb1f0,
             (uint32_t)((ulong)in_stack_ffffffffffffb1e8 >> 0x20));
  tx7_bumpfee_2 =
       std::
       map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
       ::find((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
               *)in_stack_ffffffffffffb1f0,(key_type *)in_stack_ffffffffffffb1e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    local_3800 = (_Base_ptr)
                 std::
                 map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                 ::end((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                        *)in_stack_ffffffffffffb1f0);
    std::operator==((_Self *)in_stack_ffffffffffffb1f8,(_Self *)in_stack_ffffffffffffb1f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_37f8,local_3820,local_3840,0x21d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_COutPoint,_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_COutPoint,_long>_> *)
                        in_stack_ffffffffffffb1e8);
    local_3894._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffb1f8 = "0";
    in_stack_ffffffffffffb1f0 = &local_3894;
    in_stack_ffffffffffffb1e8 = "tx7_bumpfee->second";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_3880,(undefined1 *)((long)&local_3894._vptr_lazy_ostream + 4),0x21e,1,2,
               &ppVar8->second);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  std::
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>::
  ~map((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
        *)in_stack_ffffffffffffb1e8);
  ::node::MiniMiner::~MiniMiner((MiniMiner *)in_stack_ffffffffffffb1e8);
  std::vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>::vector
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             in_stack_ffffffffffffb1e8);
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long&,long_const&,long_const&>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             in_stack_ffffffffffffb228,&in_stack_ffffffffffffb220->tx,
             (long *)CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
             (long *)in_stack_ffffffffffffb210,
             (long *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
             (long *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200));
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long&,long_const&,long_const&>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             in_stack_ffffffffffffb228,&in_stack_ffffffffffffb220->tx,
             (long *)CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
             (long *)in_stack_ffffffffffffb210,
             (long *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
             (long *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200));
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long&,long_const&,long_const&>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             in_stack_ffffffffffffb228,&in_stack_ffffffffffffb220->tx,
             (long *)CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
             (long *)in_stack_ffffffffffffb210,
             (long *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
             (long *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200));
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  pvVar11 = std::vector<long,_std::allocator<long>_>::operator[]
                      ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
                       (size_type)in_stack_ffffffffffffb1f0);
  lVar1 = *pvVar11;
  pvVar11 = std::vector<long,_std::allocator<long>_>::operator[]
                      ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
                       (size_type)in_stack_ffffffffffffb1f0);
  lVar2 = *pvVar11;
  pvVar11 = std::vector<long,_std::allocator<long>_>::operator[]
                      ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
                       (size_type)in_stack_ffffffffffffb1f0);
  lVar3 = *pvVar11;
  pvVar11 = std::vector<long,_std::allocator<long>_>::operator[]
                      ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
                       (size_type)in_stack_ffffffffffffb1f0);
  local_38b8 = lVar1 + lVar2 + lVar3 + *pvVar11;
  local_38c0 = 0x322bc;
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long,long_const&,long>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             in_stack_ffffffffffffb228,&in_stack_ffffffffffffb220->tx,
             (long *)CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
             (long *)in_stack_ffffffffffffb210,
             (long *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
             (long *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200));
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long&,long_const&,long_const&>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             in_stack_ffffffffffffb228,&in_stack_ffffffffffffb220->tx,
             (long *)CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
             (long *)in_stack_ffffffffffffb210,
             (long *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
             (long *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200));
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  pvVar11 = std::vector<long,_std::allocator<long>_>::operator[]
                      ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
                       (size_type)in_stack_ffffffffffffb1f0);
  lVar1 = *pvVar11;
  pvVar11 = std::vector<long,_std::allocator<long>_>::operator[]
                      ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
                       (size_type)in_stack_ffffffffffffb1f0);
  local_38c8 = lVar1 + *pvVar11;
  local_38d0 = 0x18894;
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long,long_const&,long>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             in_stack_ffffffffffffb228,&in_stack_ffffffffffffb220->tx,
             (long *)CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
             (long *)in_stack_ffffffffffffb210,
             (long *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
             (long *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200));
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  pvVar11 = std::vector<long,_std::allocator<long>_>::operator[]
                      ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
                       (size_type)in_stack_ffffffffffffb1f0);
  lVar1 = *pvVar11;
  pvVar11 = std::vector<long,_std::allocator<long>_>::operator[]
                      ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
                       (size_type)in_stack_ffffffffffffb1f0);
  lVar2 = *pvVar11;
  pvVar11 = std::vector<long,_std::allocator<long>_>::operator[]
                      ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
                       (size_type)in_stack_ffffffffffffb1f0);
  local_38d8 = lVar1 + lVar2 + *pvVar11;
  local_38f2._18_8_ = 0x19c1c;
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long,long_const&,long>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             in_stack_ffffffffffffb228,&in_stack_ffffffffffffb220->tx,
             (long *)CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
             (long *)in_stack_ffffffffffffb210,
             (long *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
             (long *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200));
  std::vector<long,_std::allocator<long>_>::operator[]
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
             (size_type)in_stack_ffffffffffffb1f0);
  pvVar11 = std::vector<long,_std::allocator<long>_>::operator[]
                      ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
                       (size_type)in_stack_ffffffffffffb1f0);
  lVar1 = *pvVar11;
  pvVar11 = std::vector<long,_std::allocator<long>_>::operator[]
                      ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
                       (size_type)in_stack_ffffffffffffb1f0);
  lVar2 = *pvVar11;
  pvVar11 = std::vector<long,_std::allocator<long>_>::operator[]
                      ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8,
                       (size_type)in_stack_ffffffffffffb1f0);
  local_38f2._10_8_ = lVar1 + lVar2 + *pvVar11;
  local_38f2._2_8_ = 0x30f34;
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>const&,long&,long,long_const&,long>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             in_stack_ffffffffffffb228,&in_stack_ffffffffffffb220->tx,
             (long *)CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
             (long *)in_stack_ffffffffffffb210,
             (long *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
             (long *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200));
  std::
  map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
  ::map((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
         *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  pCVar14 = (CTxMemPool *)local_1808;
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  pMVar12 = (MiniMiner *)CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  uVar4 = *(undefined8 *)pMVar12;
  uVar5 = *(uint64_t *)&(pMVar12->m_to_be_replaced)._M_t._M_impl;
  p_Var6 = (pMVar12->m_to_be_replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  mempool = pCVar14;
  pCVar14->m_total_fee =
       *(CAmount *)&(pMVar12->m_to_be_replaced)._M_t._M_impl.super__Rb_tree_header._M_header;
  pCVar14->cachedInnerUsage = (uint64_t)p_Var6;
  *(undefined8 *)pCVar14 = uVar4;
  pCVar14->totalTxSize = uVar5;
  outpoints = (vector<COutPoint,_std::allocator<COutPoint>_> *)local_38f2;
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffb1e8);
  __l_12._M_len._0_4_ = in_stack_ffffffffffffb258;
  __l_12._M_array = (iterator)in_stack_ffffffffffffb250;
  __l_12._M_len._4_4_ = in_stack_ffffffffffffb25c;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
         *)in_stack_ffffffffffffb240,__l_12,in_stack_ffffffffffffb238,
        (allocator_type *)CONCAT44(in_stack_ffffffffffffb234,in_stack_ffffffffffffb230));
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
             (transaction_identifier<false> *)
             CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200),
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffb1f8);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffb1e8);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffb1e8);
  __l_13._M_len._0_4_ = in_stack_ffffffffffffb258;
  __l_13._M_array = (iterator)in_stack_ffffffffffffb250;
  __l_13._M_len._4_4_ = in_stack_ffffffffffffb25c;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
         *)in_stack_ffffffffffffb240,__l_13,in_stack_ffffffffffffb238,
        (allocator_type *)CONCAT44(in_stack_ffffffffffffb234,in_stack_ffffffffffffb230));
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
             (transaction_identifier<false> *)
             CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200),
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffb1f8);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffb1e8);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffb1e8);
  __l_14._M_len._0_4_ = in_stack_ffffffffffffb258;
  __l_14._M_array = (iterator)in_stack_ffffffffffffb250;
  __l_14._M_len._4_4_ = in_stack_ffffffffffffb25c;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
         *)in_stack_ffffffffffffb240,__l_14,in_stack_ffffffffffffb238,
        (allocator_type *)CONCAT44(in_stack_ffffffffffffb234,in_stack_ffffffffffffb230));
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
             (transaction_identifier<false> *)
             CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200),
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffb1f8);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffb1e8);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffb1e8);
  __l_15._M_len._0_4_ = in_stack_ffffffffffffb258;
  __l_15._M_array = (iterator)in_stack_ffffffffffffb250;
  __l_15._M_len._4_4_ = in_stack_ffffffffffffb25c;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
         *)in_stack_ffffffffffffb240,__l_15,in_stack_ffffffffffffb238,
        (allocator_type *)CONCAT44(in_stack_ffffffffffffb234,in_stack_ffffffffffffb230));
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
             (transaction_identifier<false> *)
             CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200),
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffb1f8);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffb1e8);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffb1e8);
  __l_16._M_len._0_4_ = in_stack_ffffffffffffb258;
  __l_16._M_array = (iterator)in_stack_ffffffffffffb250;
  __l_16._M_len._4_4_ = in_stack_ffffffffffffb25c;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
         *)in_stack_ffffffffffffb240,__l_16,in_stack_ffffffffffffb238,
        (allocator_type *)CONCAT44(in_stack_ffffffffffffb234,in_stack_ffffffffffffb230));
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
             (transaction_identifier<false> *)
             CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200),
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffb1f8);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffb1e8);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffb1e8);
  __l_17._M_len._0_4_ = in_stack_ffffffffffffb258;
  __l_17._M_array = (iterator)in_stack_ffffffffffffb250;
  __l_17._M_len._4_4_ = in_stack_ffffffffffffb25c;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
         *)in_stack_ffffffffffffb240,__l_17,in_stack_ffffffffffffb238,
        (allocator_type *)CONCAT44(in_stack_ffffffffffffb234,in_stack_ffffffffffffb230));
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
             (transaction_identifier<false> *)
             CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200),
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffb1f8);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffb1e8);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffb1e8);
  __l_18._M_len._0_4_ = in_stack_ffffffffffffb258;
  __l_18._M_array = (iterator)in_stack_ffffffffffffb250;
  __l_18._M_len._4_4_ = in_stack_ffffffffffffb25c;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
         *)in_stack_ffffffffffffb240,__l_18,in_stack_ffffffffffffb238,
        (allocator_type *)CONCAT44(in_stack_ffffffffffffb234,in_stack_ffffffffffffb230));
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
             (transaction_identifier<false> *)
             CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200),
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffb1f8);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffb1e8);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffb1e8);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffb1e8);
  __l_19._M_len._0_4_ = in_stack_ffffffffffffb258;
  __l_19._M_array = (iterator)in_stack_ffffffffffffb250;
  __l_19._M_len._4_4_ = in_stack_ffffffffffffb25c;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
         *)in_stack_ffffffffffffb240,__l_19,in_stack_ffffffffffffb238,
        (allocator_type *)CONCAT44(in_stack_ffffffffffffb234,in_stack_ffffffffffffb230));
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffb20c,in_stack_ffffffffffffb208),
             (transaction_identifier<false> *)
             CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200),
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffb1f8);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffb1e8);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffb1e8);
  ::node::MiniMiner::MiniMiner
            (in_stack_ffffffffffffb330,in_stack_ffffffffffffb328,
             (map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffb324,in_stack_ffffffffffffb320));
  ::node::MiniMiner::MiniMiner(pMVar12,mempool,outpoints);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3938,local_3958,local_3978,0x238,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb228,
               (const_string *)in_stack_ffffffffffffb220,
               CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
               (const_string *)in_stack_ffffffffffffb210);
    ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1f8,
               SUB81((ulong)in_stack_ffffffffffffb1f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffb1f0,(basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
               (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
    in_stack_ffffffffffffb1e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_39b0,local_39d0,local_39f0,0x239,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffb1e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffb1e8);
    bVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar7);
  ::node::MiniMiner::Linearize
            ((MiniMiner *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200));
  ::node::MiniMiner::Linearize
            ((MiniMiner *)CONCAT44(in_stack_ffffffffffffb204,in_stack_ffffffffffffb200));
  local_3a00 = local_1e98;
  local_39f8 = 2;
  __begin1_2 = std::
               initializer_list<std::map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>_>
               ::begin((initializer_list<std::map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>_>
                        *)in_stack_ffffffffffffb1e8);
  pmVar13 = std::
            initializer_list<std::map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>_>
            ::end((initializer_list<std::map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>_>
                   *)in_stack_ffffffffffffb1f8);
  for (; __begin1_2 != pmVar13; __begin1_2 = __begin1_2 + 1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
                 (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffb228,
                 (const_string *)in_stack_ffffffffffffb220,
                 CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
                 (const_string *)in_stack_ffffffffffffb210);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
                 (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffb1e8);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
      local_3a58._vptr_lazy_ostream._4_4_ =
           Find<transaction_identifier<false>,unsigned_int>
                     ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                       *)CONCAT44(in_stack_ffffffffffffb234,in_stack_ffffffffffffb230),
                      (transaction_identifier<false> *)in_stack_ffffffffffffb228);
      local_3a58._vptr_lazy_ostream._0_4_ = 0;
      in_stack_ffffffffffffb1f8 = "0";
      in_stack_ffffffffffffb1f0 = &local_3a58;
      in_stack_ffffffffffffb1e8 = "Find(sequences, tx4->GetHash())";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                (local_3a40,&local_3a58.m_empty,0x23c,1,2,
                 (undefined1 *)((long)&local_3a58._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffb1e8);
      bVar7 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
                 (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffb228,
                 (const_string *)in_stack_ffffffffffffb220,
                 CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
                 (const_string *)in_stack_ffffffffffffb210);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
                 (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffb1e8);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
      local_3ab0._vptr_lazy_ostream._4_4_ =
           Find<transaction_identifier<false>,unsigned_int>
                     ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                       *)CONCAT44(in_stack_ffffffffffffb234,in_stack_ffffffffffffb230),
                      (transaction_identifier<false> *)in_stack_ffffffffffffb228);
      local_3ab0._vptr_lazy_ostream._0_4_ = 1;
      in_stack_ffffffffffffb1f8 = "1";
      in_stack_ffffffffffffb1f0 = &local_3ab0;
      in_stack_ffffffffffffb1e8 = "Find(sequences, tx2->GetHash())";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                (local_3a98,&local_3ab0.m_empty,0x23d,1,2,
                 (undefined1 *)((long)&local_3ab0._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffb1e8);
      bVar7 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
                 (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffb228,
                 (const_string *)in_stack_ffffffffffffb220,
                 CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
                 (const_string *)in_stack_ffffffffffffb210);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
                 (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffb1e8);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
      local_3b08._vptr_lazy_ostream._4_4_ =
           Find<transaction_identifier<false>,unsigned_int>
                     ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                       *)CONCAT44(in_stack_ffffffffffffb234,in_stack_ffffffffffffb230),
                      (transaction_identifier<false> *)in_stack_ffffffffffffb228);
      local_3b08._vptr_lazy_ostream._0_4_ = 2;
      in_stack_ffffffffffffb1f8 = "2";
      in_stack_ffffffffffffb1f0 = &local_3b08;
      in_stack_ffffffffffffb1e8 = "Find(sequences, tx5->GetHash())";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                (local_3af0,&local_3b08.m_empty,0x240,1,2,
                 (undefined1 *)((long)&local_3b08._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffb1e8);
      bVar7 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
                 (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffb228,
                 (const_string *)in_stack_ffffffffffffb220,
                 CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
                 (const_string *)in_stack_ffffffffffffb210);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
                 (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffb1e8);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
      local_3b60._vptr_lazy_ostream._4_4_ =
           Find<transaction_identifier<false>,unsigned_int>
                     ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                       *)CONCAT44(in_stack_ffffffffffffb234,in_stack_ffffffffffffb230),
                      (transaction_identifier<false> *)in_stack_ffffffffffffb228);
      local_3b60._vptr_lazy_ostream._0_4_ = 2;
      in_stack_ffffffffffffb1f8 = "2";
      in_stack_ffffffffffffb1f0 = &local_3b60;
      in_stack_ffffffffffffb1e8 = "Find(sequences, tx7->GetHash())";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                (local_3b48,&local_3b60.m_empty,0x241,1,2,
                 (undefined1 *)((long)&local_3b60._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffb1e8);
      bVar7 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
                 (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffb228,
                 (const_string *)in_stack_ffffffffffffb220,
                 CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
                 (const_string *)in_stack_ffffffffffffb210);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
                 (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffb1e8);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
      local_3bb8._vptr_lazy_ostream._4_4_ =
           Find<transaction_identifier<false>,unsigned_int>
                     ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                       *)CONCAT44(in_stack_ffffffffffffb234,in_stack_ffffffffffffb230),
                      (transaction_identifier<false> *)in_stack_ffffffffffffb228);
      local_3bb8._vptr_lazy_ostream._0_4_ = 3;
      in_stack_ffffffffffffb1f8 = "3";
      in_stack_ffffffffffffb1f0 = &local_3bb8;
      in_stack_ffffffffffffb1e8 = "Find(sequences, tx0->GetHash())";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                (local_3ba0,&local_3bb8.m_empty,0x244,1,2,
                 (undefined1 *)((long)&local_3bb8._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffb1e8);
      bVar7 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
                 (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffb228,
                 (const_string *)in_stack_ffffffffffffb220,
                 CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
                 (const_string *)in_stack_ffffffffffffb210);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
                 (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffb1e8);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
      local_3c10._vptr_lazy_ostream._4_4_ =
           Find<transaction_identifier<false>,unsigned_int>
                     ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                       *)CONCAT44(in_stack_ffffffffffffb234,in_stack_ffffffffffffb230),
                      (transaction_identifier<false> *)in_stack_ffffffffffffb228);
      local_3c10._vptr_lazy_ostream._0_4_ = 3;
      in_stack_ffffffffffffb1f8 = "3";
      in_stack_ffffffffffffb1f0 = &local_3c10;
      in_stack_ffffffffffffb1e8 = "Find(sequences, tx1->GetHash())";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                (local_3bf8,&local_3c10.m_empty,0x245,1,2,
                 (undefined1 *)((long)&local_3c10._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffb1e8);
      bVar7 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
                 (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffb228,
                 (const_string *)in_stack_ffffffffffffb220,
                 CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
                 (const_string *)in_stack_ffffffffffffb210);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
                 (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffb1e8);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
      local_3c68._vptr_lazy_ostream._4_4_ =
           Find<transaction_identifier<false>,unsigned_int>
                     ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                       *)CONCAT44(in_stack_ffffffffffffb234,in_stack_ffffffffffffb230),
                      (transaction_identifier<false> *)in_stack_ffffffffffffb228);
      local_3c68._vptr_lazy_ostream._0_4_ = 3;
      in_stack_ffffffffffffb1f8 = "3";
      in_stack_ffffffffffffb1f0 = &local_3c68;
      in_stack_ffffffffffffb1e8 = "Find(sequences, tx3->GetHash())";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                (local_3c50,&local_3c68.m_empty,0x246,1,2,
                 (undefined1 *)((long)&local_3c68._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffb1e8);
      bVar7 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
                 (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1e8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffb228,
                 (const_string *)in_stack_ffffffffffffb220,
                 CONCAT44(in_stack_ffffffffffffb21c,in_stack_ffffffffffffb218),
                 (const_string *)in_stack_ffffffffffffb210);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffb1f0,(char (*) [1])in_stack_ffffffffffffb1e8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffb1f8,
                 (pointer)in_stack_ffffffffffffb1f0,(unsigned_long)in_stack_ffffffffffffb1e8);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffb1e8);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffb1e8);
      in_stack_ffffffffffffb234 =
           Find<transaction_identifier<false>,unsigned_int>
                     ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                       *)CONCAT44(in_stack_ffffffffffffb234,in_stack_ffffffffffffb230),
                      (transaction_identifier<false> *)in_stack_ffffffffffffb228);
      local_3cc0._vptr_lazy_ostream._0_4_ = 4;
      in_stack_ffffffffffffb1f8 = "4";
      in_stack_ffffffffffffb1f0 = &local_3cc0;
      in_stack_ffffffffffffb1e8 = "Find(sequences, tx6->GetHash())";
      local_3cc0._vptr_lazy_ostream._4_4_ = in_stack_ffffffffffffb234;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                (local_3ca8,&local_3cc0.m_empty,0x249,1,2,
                 (undefined1 *)((long)&local_3cc0._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffb1e8);
      bVar7 = boost::test_tools::tt_detail::dummy_cond();
      in_stack_ffffffffffffb230 = CONCAT13(bVar7,(int3)in_stack_ffffffffffffb230);
    } while (bVar7);
  }
  pMVar12 = (MiniMiner *)local_1e98;
  local_4c78 = &miniminer_pool;
  do {
    local_4c78 = (MiniMiner *)&local_4c78[-1].m_descendant_set_by_txid;
    std::
    map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
    ::~map((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
            *)in_stack_ffffffffffffb1e8);
  } while (local_4c78 != pMVar12);
  ::node::MiniMiner::~MiniMiner((MiniMiner *)in_stack_ffffffffffffb1e8);
  ::node::MiniMiner::~MiniMiner((MiniMiner *)in_stack_ffffffffffffb1e8);
  std::
  map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
  ::~map((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
          *)in_stack_ffffffffffffb1e8);
  std::vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>::~vector
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             in_stack_ffffffffffffb1f8);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffb1f8);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffb1f8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_ffffffffffffb1f8);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffb1e8);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffb1e8);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffb1e8);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffb1e8);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffb1e8);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffb1e8);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffb1e8);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffb1e8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffb1e8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffb1e8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(miniminer_overlap, TestChain100Setup)
{
/*      Tx graph for `miniminer_overlap` unit test:
 *
 *     coinbase_tx [mined]        ... block-chain
 *  -------------------------------------------------
 *      /   |   \          \      ... mempool
 *     /    |    \         |
 *   tx0   tx1   tx2      tx4
 *  [low] [med] [high]   [high]
 *     \    |    /         |
 *      \   |   /         tx5
 *       \  |  /         [low]
 *         tx3          /     \
 *        [high]       tx6    tx7
 *                    [med]  [high]
 *
 *  NOTE:
 *  -> "low"/"med"/"high" denote the _absolute_ fee of each tx
 *  -> tx3 has 3 inputs and 3 outputs, all other txs have 1 input and 2 outputs
 *  -> tx3's feerate is lower than tx2's, as tx3 has more weight (due to having more inputs and outputs)
 *
 *  -> tx2_FR = high / tx2_vsize
 *  -> tx3_FR = high / tx3_vsize
 *  -> tx3_ASFR = (low+med+high+high) / (tx0_vsize + tx1_vsize + tx2_vsize + tx3_vsize)
 *  -> tx4_FR = high / tx4_vsize
 *  -> tx6_ASFR = (high+low+med) / (tx4_vsize + tx5_vsize + tx6_vsize)
 *  -> tx7_ASFR = (high+low+high) / (tx4_vsize + tx5_vsize + tx7_vsize) */

    CTxMemPool& pool = *Assert(m_node.mempool);
    LOCK2(::cs_main, pool.cs);
    TestMemPoolEntryHelper entry;

    // Create 3 parents of different feerates, and 1 child spending outputs from all 3 parents.
    const auto tx0 = make_tx({COutPoint{m_coinbase_txns[0]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx0));
    const auto tx1 = make_tx({COutPoint{m_coinbase_txns[1]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(med_fee).FromTx(tx1));
    const auto tx2 = make_tx({COutPoint{m_coinbase_txns[2]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx2));
    const auto tx3 = make_tx({COutPoint{tx0->GetHash(), 0}, COutPoint{tx1->GetHash(), 0}, COutPoint{tx2->GetHash(), 0}}, /*num_outputs=*/3);
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx3));

    // Create 1 grandparent and 1 parent, then 2 children.
    const auto tx4 = make_tx({COutPoint{m_coinbase_txns[3]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx4));
    const auto tx5 = make_tx({COutPoint{tx4->GetHash(), 0}}, /*num_outputs=*/3);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx5));
    const auto tx6 = make_tx({COutPoint{tx5->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(med_fee).FromTx(tx6));
    const auto tx7 = make_tx({COutPoint{tx5->GetHash(), 1}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx7));

    std::vector<CTransactionRef> all_transactions{tx0, tx1, tx2, tx3, tx4, tx5, tx6, tx7};
    std::vector<int64_t> tx_vsizes;
    tx_vsizes.reserve(all_transactions.size());
    for (const auto& tx : all_transactions) tx_vsizes.push_back(GetVirtualTransactionSize(*tx));

    std::vector<COutPoint> all_unspent_outpoints({
        COutPoint{tx0->GetHash(), 1},
        COutPoint{tx1->GetHash(), 1},
        COutPoint{tx2->GetHash(), 1},
        COutPoint{tx3->GetHash(), 0},
        COutPoint{tx3->GetHash(), 1},
        COutPoint{tx3->GetHash(), 2},
        COutPoint{tx4->GetHash(), 1},
        COutPoint{tx5->GetHash(), 2},
        COutPoint{tx6->GetHash(), 0},
        COutPoint{tx7->GetHash(), 0}
    });
    for (const auto& outpoint : all_unspent_outpoints) BOOST_CHECK(!pool.isSpent(outpoint));

    const auto tx2_feerate = CFeeRate(high_fee, tx_vsizes[2]);
    const auto tx3_feerate = CFeeRate(high_fee, tx_vsizes[3]);
    // tx3's feerate is lower than tx2's. same fee, different weight.
    BOOST_CHECK(tx2_feerate > tx3_feerate);
    const auto tx3_anc_feerate = CFeeRate(low_fee + med_fee + high_fee + high_fee, tx_vsizes[0] + tx_vsizes[1] + tx_vsizes[2] + tx_vsizes[3]);
    const auto& tx3_entry{*Assert(pool.GetEntry(tx3->GetHash()))};
    BOOST_CHECK(tx3_anc_feerate == CFeeRate(tx3_entry.GetModFeesWithAncestors(), tx3_entry.GetSizeWithAncestors()));
    const auto tx4_feerate = CFeeRate(high_fee, tx_vsizes[4]);
    const auto tx6_anc_feerate = CFeeRate(high_fee + low_fee + med_fee, tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[6]);
    const auto& tx6_entry{*Assert(pool.GetEntry(tx6->GetHash()))};
    BOOST_CHECK(tx6_anc_feerate == CFeeRate(tx6_entry.GetModFeesWithAncestors(), tx6_entry.GetSizeWithAncestors()));
    const auto tx7_anc_feerate = CFeeRate(high_fee + low_fee + high_fee, tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[7]);
    const auto& tx7_entry{*Assert(pool.GetEntry(tx7->GetHash()))};
    BOOST_CHECK(tx7_anc_feerate == CFeeRate(tx7_entry.GetModFeesWithAncestors(), tx7_entry.GetSizeWithAncestors()));
    BOOST_CHECK(tx4_feerate > tx6_anc_feerate);
    BOOST_CHECK(tx4_feerate > tx7_anc_feerate);

    // Extremely high feerate: everybody's bumpfee is from their full ancestor set.
    {
        node::MiniMiner mini_miner(pool, all_unspent_outpoints);
        const CFeeRate very_high_feerate(COIN);
        BOOST_CHECK(tx3_anc_feerate < very_high_feerate);
        BOOST_CHECK(mini_miner.IsReadyToCalculate());
        auto bump_fees = mini_miner.CalculateBumpFees(very_high_feerate);
        BOOST_CHECK_EQUAL(bump_fees.size(), all_unspent_outpoints.size());
        BOOST_CHECK(!mini_miner.IsReadyToCalculate());
        BOOST_CHECK(sanity_check(all_transactions, bump_fees));
        const auto tx0_bumpfee = bump_fees.find(COutPoint{tx0->GetHash(), 1});
        BOOST_CHECK(tx0_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx0_bumpfee->second, very_high_feerate.GetFee(tx_vsizes[0]) - low_fee);
        const auto tx3_bumpfee = bump_fees.find(COutPoint{tx3->GetHash(), 0});
        BOOST_CHECK(tx3_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx3_bumpfee->second,
            very_high_feerate.GetFee(tx_vsizes[0] + tx_vsizes[1] + tx_vsizes[2] + tx_vsizes[3]) - (low_fee + med_fee + high_fee + high_fee));
        const auto tx6_bumpfee = bump_fees.find(COutPoint{tx6->GetHash(), 0});
        BOOST_CHECK(tx6_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx6_bumpfee->second,
            very_high_feerate.GetFee(tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[6]) - (high_fee + low_fee + med_fee));
        const auto tx7_bumpfee = bump_fees.find(COutPoint{tx7->GetHash(), 0});
        BOOST_CHECK(tx7_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx7_bumpfee->second,
            very_high_feerate.GetFee(tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[7]) - (high_fee + low_fee + high_fee));
        // Total fees: if spending multiple outputs from tx3 don't double-count fees.
        node::MiniMiner mini_miner_total_tx3(pool, {COutPoint{tx3->GetHash(), 0}, COutPoint{tx3->GetHash(), 1}});
        BOOST_CHECK(mini_miner_total_tx3.IsReadyToCalculate());
        const auto tx3_bump_fee = mini_miner_total_tx3.CalculateTotalBumpFees(very_high_feerate);
        BOOST_CHECK(!mini_miner_total_tx3.IsReadyToCalculate());
        BOOST_CHECK(tx3_bump_fee.has_value());
        BOOST_CHECK_EQUAL(tx3_bump_fee.value(),
            very_high_feerate.GetFee(tx_vsizes[0] + tx_vsizes[1] + tx_vsizes[2] + tx_vsizes[3]) - (low_fee + med_fee + high_fee + high_fee));
        // Total fees: if spending both tx6 and tx7, don't double-count fees.
        node::MiniMiner mini_miner_tx6_tx7(pool, {COutPoint{tx6->GetHash(), 0}, COutPoint{tx7->GetHash(), 0}});
        BOOST_CHECK(mini_miner_tx6_tx7.IsReadyToCalculate());
        const auto tx6_tx7_bumpfee = mini_miner_tx6_tx7.CalculateTotalBumpFees(very_high_feerate);
        BOOST_CHECK(!mini_miner_tx6_tx7.IsReadyToCalculate());
        BOOST_CHECK(tx6_tx7_bumpfee.has_value());
        BOOST_CHECK_EQUAL(tx6_tx7_bumpfee.value(),
            very_high_feerate.GetFee(tx_vsizes[4] + tx_vsizes[5] + tx_vsizes[6] + tx_vsizes[7]) - (high_fee + low_fee + med_fee + high_fee));
    }
    // Feerate just below tx4: tx6 and tx7 have different bump fees.
    {
        const auto just_below_tx4 = CFeeRate(tx4_feerate.GetFeePerK() - 5);
        node::MiniMiner mini_miner(pool, all_unspent_outpoints);
        BOOST_CHECK(mini_miner.IsReadyToCalculate());
        auto bump_fees = mini_miner.CalculateBumpFees(just_below_tx4);
        BOOST_CHECK(!mini_miner.IsReadyToCalculate());
        BOOST_CHECK_EQUAL(bump_fees.size(), all_unspent_outpoints.size());
        BOOST_CHECK(sanity_check(all_transactions, bump_fees));
        const auto tx6_bumpfee = bump_fees.find(COutPoint{tx6->GetHash(), 0});
        BOOST_CHECK(tx6_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx6_bumpfee->second, just_below_tx4.GetFee(tx_vsizes[5] + tx_vsizes[6]) - (low_fee + med_fee));
        const auto tx7_bumpfee = bump_fees.find(COutPoint{tx7->GetHash(), 0});
        BOOST_CHECK(tx7_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx7_bumpfee->second, just_below_tx4.GetFee(tx_vsizes[5] + tx_vsizes[7]) - (low_fee + high_fee));
        // Total fees: if spending both tx6 and tx7, don't double-count fees.
        node::MiniMiner mini_miner_tx6_tx7(pool, {COutPoint{tx6->GetHash(), 0}, COutPoint{tx7->GetHash(), 0}});
        BOOST_CHECK(mini_miner_tx6_tx7.IsReadyToCalculate());
        const auto tx6_tx7_bumpfee = mini_miner_tx6_tx7.CalculateTotalBumpFees(just_below_tx4);
        BOOST_CHECK(!mini_miner_tx6_tx7.IsReadyToCalculate());
        BOOST_CHECK(tx6_tx7_bumpfee.has_value());
        BOOST_CHECK_EQUAL(tx6_tx7_bumpfee.value(), just_below_tx4.GetFee(tx_vsizes[5] + tx_vsizes[6]) - (low_fee + med_fee));
    }
    // Feerate between tx6 and tx7's ancestor feerates: don't need to bump tx5 because tx7 already does.
    {
        const auto just_above_tx6 = CFeeRate(med_fee + 10, tx_vsizes[6]);
        BOOST_CHECK(just_above_tx6 <= CFeeRate(low_fee + high_fee, tx_vsizes[5] + tx_vsizes[7]));
        node::MiniMiner mini_miner(pool, all_unspent_outpoints);
        BOOST_CHECK(mini_miner.IsReadyToCalculate());
        auto bump_fees = mini_miner.CalculateBumpFees(just_above_tx6);
        BOOST_CHECK(!mini_miner.IsReadyToCalculate());
        BOOST_CHECK_EQUAL(bump_fees.size(), all_unspent_outpoints.size());
        BOOST_CHECK(sanity_check(all_transactions, bump_fees));
        const auto tx6_bumpfee = bump_fees.find(COutPoint{tx6->GetHash(), 0});
        BOOST_CHECK(tx6_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx6_bumpfee->second, just_above_tx6.GetFee(tx_vsizes[6]) - (med_fee));
        const auto tx7_bumpfee = bump_fees.find(COutPoint{tx7->GetHash(), 0});
        BOOST_CHECK(tx7_bumpfee != bump_fees.end());
        BOOST_CHECK_EQUAL(tx7_bumpfee->second, 0);
    }
    // Check linearization order
    std::vector<node::MiniMinerMempoolEntry> miniminer_info;
    miniminer_info.emplace_back(tx0,/*vsize_self=*/tx_vsizes[0],                     /*vsize_ancestor=*/tx_vsizes[0], /*fee_self=*/low_fee,   /*fee_ancestor=*/low_fee);
    miniminer_info.emplace_back(tx1,               tx_vsizes[1],                                        tx_vsizes[1],              med_fee,                    med_fee);
    miniminer_info.emplace_back(tx2,               tx_vsizes[2],                                        tx_vsizes[2],             high_fee,                   high_fee);
    miniminer_info.emplace_back(tx3,               tx_vsizes[3], tx_vsizes[0]+tx_vsizes[1]+tx_vsizes[2]+tx_vsizes[3],             high_fee, low_fee+med_fee+2*high_fee);
    miniminer_info.emplace_back(tx4,               tx_vsizes[4],                                        tx_vsizes[4],             high_fee,                   high_fee);
    miniminer_info.emplace_back(tx5,               tx_vsizes[5],                           tx_vsizes[4]+tx_vsizes[5],              low_fee,         low_fee + high_fee);
    miniminer_info.emplace_back(tx6,               tx_vsizes[6],              tx_vsizes[4]+tx_vsizes[5]+tx_vsizes[6],              med_fee,   high_fee+low_fee+med_fee);
    miniminer_info.emplace_back(tx7,               tx_vsizes[7],              tx_vsizes[4]+tx_vsizes[5]+tx_vsizes[7],             high_fee,  high_fee+low_fee+high_fee);

    std::map<Txid, std::set<Txid>> descendant_caches;
    descendant_caches.emplace(tx0->GetHash(), std::set<Txid>{tx0->GetHash(), tx3->GetHash()});
    descendant_caches.emplace(tx1->GetHash(), std::set<Txid>{tx1->GetHash(), tx3->GetHash()});
    descendant_caches.emplace(tx2->GetHash(), std::set<Txid>{tx2->GetHash(), tx3->GetHash()});
    descendant_caches.emplace(tx3->GetHash(), std::set<Txid>{tx3->GetHash()});
    descendant_caches.emplace(tx4->GetHash(), std::set<Txid>{tx4->GetHash(), tx5->GetHash(), tx6->GetHash(), tx7->GetHash()});
    descendant_caches.emplace(tx5->GetHash(), std::set<Txid>{tx5->GetHash(), tx6->GetHash(), tx7->GetHash()});
    descendant_caches.emplace(tx6->GetHash(), std::set<Txid>{tx6->GetHash()});
    descendant_caches.emplace(tx7->GetHash(), std::set<Txid>{tx7->GetHash()});

    node::MiniMiner miniminer_manual(miniminer_info, descendant_caches);
    // Use unspent outpoints to avoid entries being omitted.
    node::MiniMiner miniminer_pool(pool, all_unspent_outpoints);
    BOOST_CHECK(miniminer_manual.IsReadyToCalculate());
    BOOST_CHECK(miniminer_pool.IsReadyToCalculate());
    for (const auto& sequences : {miniminer_manual.Linearize(), miniminer_pool.Linearize()}) {
        // tx2 and tx4 selected first: high feerate with nothing to bump
        BOOST_CHECK_EQUAL(Find(sequences, tx4->GetHash()), 0);
        BOOST_CHECK_EQUAL(Find(sequences, tx2->GetHash()), 1);

        // tx5 + tx7 CPFP
        BOOST_CHECK_EQUAL(Find(sequences, tx5->GetHash()), 2);
        BOOST_CHECK_EQUAL(Find(sequences, tx7->GetHash()), 2);

        // tx0 and tx1 CPFP'd by tx3
        BOOST_CHECK_EQUAL(Find(sequences, tx0->GetHash()), 3);
        BOOST_CHECK_EQUAL(Find(sequences, tx1->GetHash()), 3);
        BOOST_CHECK_EQUAL(Find(sequences, tx3->GetHash()), 3);

        // tx6 at medium feerate
        BOOST_CHECK_EQUAL(Find(sequences, tx6->GetHash()), 4);
    }
}